

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lib530.c
# Opt level: O2

int test(char *URL)

{
  uint __i;
  uint uVar1;
  int iVar2;
  long lVar3;
  CURL *pCVar4;
  undefined8 uVar5;
  uint *puVar6;
  FILE *pFVar7;
  ulong uVar8;
  char *pcVar9;
  long lVar10;
  timeval tVar11;
  undefined8 uStack_300;
  int maxfd;
  int running;
  timeval interval;
  CURL *curl [4];
  fd_set exc;
  fd_set wr;
  fd_set rd;
  char target_url [256];
  
  for (lVar3 = 0; lVar3 != 4; lVar3 = lVar3 + 1) {
    curl[lVar3] = (CURL *)0x0;
  }
  tv_test_start = tutil_tvnow();
  uVar1 = curl_global_init(3);
  pFVar7 = _stderr;
  if (uVar1 != 0) {
    uVar5 = curl_easy_strerror(uVar1);
    fprintf(pFVar7,"%s:%d curl_global_init() failed, with code %d (%s)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
            ,0x2e,(ulong)uVar1,uVar5);
    goto LAB_001026a8;
  }
  lVar3 = curl_multi_init();
  if (lVar3 == 0) {
    fprintf(_stderr,"%s:%d curl_multi_init() failed\n",
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
            ,0x30);
    uVar1 = 0x7b;
  }
  else {
    lVar10 = 0;
    do {
      if (lVar10 == 4) {
        uVar1 = curl_multi_setopt(lVar3,3,1);
        pFVar7 = _stderr;
        uVar8 = (ulong)uVar1;
        if (uVar1 != 0) {
          uVar5 = curl_multi_strerror(uVar1);
          pcVar9 = "%s:%d curl_multi_setopt() failed, with code %d (%s)\n";
          uStack_300 = 0x42;
          goto LAB_00102662;
        }
        fwrite("Start at URL 0\n",0xf,1,_stderr);
        goto LAB_00102475;
      }
      pCVar4 = (CURL *)curl_easy_init();
      curl[lVar10] = pCVar4;
      if (pCVar4 == (CURL *)0x0) {
        fprintf(_stderr,"%s:%d curl_easy_init() failed\n",
                "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
                ,0x35);
        uVar1 = 0x7c;
        goto LAB_00102673;
      }
      sprintf(target_url,"%s%04i",URL,(ulong)((int)lVar10 + 1));
      target_url[0xff] = '\0';
      uVar1 = curl_easy_setopt(pCVar4,0x2712,target_url);
      pFVar7 = _stderr;
      if (uVar1 != 0) {
        uVar8 = (ulong)uVar1;
        uVar5 = curl_easy_strerror(uVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x39;
        goto LAB_00102662;
      }
      uVar1 = curl_easy_setopt(pCVar4,0x29,1);
      pFVar7 = _stderr;
      if (uVar1 != 0) {
        uVar8 = (ulong)uVar1;
        uVar5 = curl_easy_strerror(uVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x3b;
        goto LAB_00102662;
      }
      uVar1 = curl_easy_setopt(pCVar4,0x2a,1);
      pFVar7 = _stderr;
      if (uVar1 != 0) {
        uVar8 = (ulong)uVar1;
        uVar5 = curl_easy_strerror(uVar1);
        pcVar9 = "%s:%d curl_easy_setopt() failed, with code %d (%s)\n";
        uStack_300 = 0x3d;
        goto LAB_00102662;
      }
      uVar1 = curl_multi_add_handle(lVar3,pCVar4);
      pFVar7 = _stderr;
      lVar10 = lVar10 + 1;
    } while (uVar1 == 0);
    uVar8 = (ulong)uVar1;
    uVar5 = curl_multi_strerror(uVar1);
    pcVar9 = "%s:%d curl_multi_add_handle() failed, with code %d (%s)\n";
    uStack_300 = 0x3f;
LAB_00102662:
    uVar1 = (uint)uVar8;
    fprintf(pFVar7,pcVar9,
            "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
            ,uStack_300,uVar8,uVar5);
  }
  goto LAB_00102673;
  while( true ) {
    tVar11 = tutil_tvnow();
    lVar10 = tutil_tvdiff(tVar11,tv_test_start);
    if (60000 < lVar10) {
      uStack_300 = 0x50;
      goto LAB_0010271e;
    }
    if (running == 0) {
      uVar1 = 0;
      goto LAB_00102673;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      rd.__fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      wr.__fds_bits[lVar10] = 0;
    }
    for (lVar10 = 0; lVar10 != 0x10; lVar10 = lVar10 + 1) {
      exc.__fds_bits[lVar10] = 0;
    }
    uVar1 = curl_multi_fdset(lVar3,&rd,&wr,&exc,&maxfd);
    pFVar7 = _stderr;
    if (uVar1 != 0) {
      uVar8 = (ulong)uVar1;
      uVar5 = curl_multi_strerror(uVar1);
      pcVar9 = "%s:%d curl_multi_fdset() failed, with code %d (%s)\n";
      uStack_300 = 0x59;
      goto LAB_00102662;
    }
    if (maxfd < -1) {
      pcVar9 = "%s:%d curl_multi_fdset() succeeded, but returned invalid max_fd value (%d)\n";
      uStack_300 = 0x59;
      goto LAB_0010276f;
    }
    iVar2 = select_wrapper(maxfd + 1,&rd,&wr,&exc,&interval);
    if (iVar2 == -1) {
      puVar6 = (uint *)__errno_location();
      pFVar7 = _stderr;
      uVar1 = *puVar6;
      pcVar9 = strerror(uVar1);
      fprintf(pFVar7,"%s:%d select() failed, with errno %d (%s)\n",
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
              ,0x5d,(ulong)uVar1,pcVar9);
      uVar1 = 0x79;
      goto LAB_00102673;
    }
    tVar11 = tutil_tvnow();
    lVar10 = tutil_tvdiff(tVar11,tv_test_start);
    if (60000 < lVar10) break;
LAB_00102475:
    maxfd = -99;
    interval.tv_sec = 1;
    interval.tv_usec = 0;
    uVar1 = curl_multi_perform(lVar3,&running);
    pFVar7 = _stderr;
    if (uVar1 != 0) {
      uVar8 = (ulong)uVar1;
      uVar5 = curl_multi_strerror(uVar1);
      pcVar9 = "%s:%d curl_multi_perform() failed, with code %d (%s)\n";
      uStack_300 = 0x4e;
      goto LAB_00102662;
    }
    if (running < 0) {
      pcVar9 = 
      "%s:%d curl_multi_perform() succeeded, but returned invalid running_handles value (%d)\n";
      uStack_300 = 0x4e;
LAB_0010276f:
      fprintf(_stderr,pcVar9,
              "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
              ,uStack_300);
      uVar1 = 0x7a;
      goto LAB_00102673;
    }
  }
  uStack_300 = 0x5f;
LAB_0010271e:
  fprintf(_stderr,"%s:%d ABORTING TEST, since it seems that it would have run forever.\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/lesstif[P]curl/tests/libtest/lib530.c"
          ,uStack_300);
  uVar1 = 0x7d;
LAB_00102673:
  for (lVar10 = 0; lVar10 != 4; lVar10 = lVar10 + 1) {
    pCVar4 = curl[lVar10];
    curl_multi_remove_handle(lVar3,pCVar4);
    curl_easy_cleanup(pCVar4);
  }
  curl_multi_cleanup(lVar3);
  curl_global_cleanup();
LAB_001026a8:
  return uVar1;
}

Assistant:

int test(char *URL)
{
  int res = 0;
  CURL *curl[NUM_HANDLES];
  int running;
  CURLM *m = NULL;
  int i;
  char target_url[256];

  for(i=0; i < NUM_HANDLES; i++)
    curl[i] = NULL;

  start_test_timing();

  global_init(CURL_GLOBAL_ALL);

  multi_init(m);

  /* get NUM_HANDLES easy handles */
  for(i=0; i < NUM_HANDLES; i++) {
    /* get an easy handle */
    easy_init(curl[i]);
    /* specify target */
    sprintf(target_url, "%s%04i", URL, i + 1);
    target_url[sizeof(target_url) - 1] = '\0';
    easy_setopt(curl[i], CURLOPT_URL, target_url);
    /* go verbose */
    easy_setopt(curl[i], CURLOPT_VERBOSE, 1L);
    /* include headers */
    easy_setopt(curl[i], CURLOPT_HEADER, 1L);
    /* add handle to multi */
    multi_add_handle(m, curl[i]);
  }

  multi_setopt(m, CURLMOPT_PIPELINING, 1L);

  fprintf(stderr, "Start at URL 0\n");

  for(;;) {
    struct timeval interval;
    fd_set rd, wr, exc;
    int maxfd = -99;

    interval.tv_sec = 1;
    interval.tv_usec = 0;

    multi_perform(m, &running);

    abort_on_test_timeout();

    if(!running)
      break; /* done */

    FD_ZERO(&rd);
    FD_ZERO(&wr);
    FD_ZERO(&exc);

    multi_fdset(m, &rd, &wr, &exc, &maxfd);

    /* At this point, maxfd is guaranteed to be greater or equal than -1. */

    select_test(maxfd+1, &rd, &wr, &exc, &interval);

    abort_on_test_timeout();
  }

test_cleanup:

  /* proper cleanup sequence - type PB */

  for(i=0; i < NUM_HANDLES; i++) {
    curl_multi_remove_handle(m, curl[i]);
    curl_easy_cleanup(curl[i]);
  }

  curl_multi_cleanup(m);
  curl_global_cleanup();

  return res;
}